

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

timestamp_t __thiscall DigitalConsumer::getData(DigitalConsumer *this,int16_t *dest)

{
  int iVar1;
  uchar *puVar2;
  size_type sVar3;
  undefined4 extraout_var;
  reference pvVar4;
  uint *puVar5;
  long in_RSI;
  HFSubConsumer *in_RDI;
  timestamp_t tVar6;
  int bit;
  int byt;
  size_t i;
  int offset;
  byte *src;
  ulong local_38;
  int local_2c;
  uint local_10;
  int64_t local_8;
  
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ceb04);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &in_RDI[1].super_HighFreqSub.dt.origin);
  iVar1 = (*(in_RDI->super_HighFreqSub)._vptr_HighFreqSub[5])(in_RDI,puVar2,sVar3);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_10 = 0;
    local_8 = 0;
  }
  else {
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ceb5a);
    local_2c = 0;
    local_38 = 0;
    while( true ) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&in_RDI[1].super_HighFreqSub.dt.origin.field_2 + 8));
      if (sVar3 <= local_38) break;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          ((long)&in_RDI[1].super_HighFreqSub.dt.origin.field_2 + 8),local_38);
      iVar1 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          ((long)&in_RDI[1].super_HighFreqSub.dt.origin.field_2 + 8),local_38 + 1);
      *(short *)(in_RSI + (long)local_2c * 2) =
           (short)((int)((uint)puVar2[(long)iVar1 + 4] & 1 << ((byte)*pvVar4 & 0x1f)) >>
                  ((byte)*pvVar4 & 0x1f));
      local_2c = local_2c + 1;
      local_38 = local_38 + 2;
    }
    puVar5 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cec3d);
    local_10 = *puVar5;
    local_8 = HFSubConsumer::lastSysTimestamp(in_RDI);
  }
  tVar6._4_4_ = 0;
  tVar6.trodes_timestamp = local_10;
  tVar6.system_timestamp = local_8;
  return tVar6;
}

Assistant:

timestamp_t DigitalConsumer::getData(int16_t *dest){
    if(!readData(temp_buffer.data(), temp_buffer.size())){
        return {0,0};
    }
    byte *src = temp_buffer.data() + sizeof(uint32_t); // start of digital data is after timestamp
    int offset = 0;
    for(size_t i = 0; i < args.indices.size(); i += 2){
        const int byt = args.indices[i];
        const int bit = args.indices[i+1];
        //Unlike the rest, digital data is one bit at a time. May be a waste, but we are converting
        //the 0/1's to int16_t numbers for convenience
        //1<<bit creates mask for bit position, & operation to isolate that bit,
        //shift the bit to the first position to get 0 or 1, store it at the second byte of a int16_t num
        dest[offset] = (int16_t)((src[byt] & (1 << bit)) >> bit); //Convert to 2byte int
        ++offset;
    }
    return {*(uint32_t*)(temp_buffer.data()), lastSysTimestamp()}; //Timestamp at beginning of packet
}